

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_server_del_handler(nni_http_server *s,nni_http_handler *h)

{
  nni_http_handler *local_28;
  nni_http_handler *srch;
  nng_err rv;
  nni_http_handler *h_local;
  nni_http_server *s_local;
  
  srch._4_4_ = NNG_ENOENT;
  nni_mtx_lock(&s->mtx);
  local_28 = (nni_http_handler *)nni_list_first(&s->handlers);
  do {
    if (local_28 == (nni_http_handler *)0x0) {
LAB_00153dc5:
      nni_mtx_unlock(&s->mtx);
      return srch._4_4_;
    }
    if (local_28 == h) {
      nni_list_remove(&s->handlers,h);
      srch._4_4_ = NNG_OK;
      goto LAB_00153dc5;
    }
    local_28 = (nni_http_handler *)nni_list_next(&s->handlers,local_28);
  } while( true );
}

Assistant:

nng_err
nni_http_server_del_handler(nni_http_server *s, nni_http_handler *h)
{
	nng_err           rv = NNG_ENOENT;
	nni_http_handler *srch;
	nni_mtx_lock(&s->mtx);
	NNI_LIST_FOREACH (&s->handlers, srch) {
		if (srch == h) {
			// NB: We are giving the caller our reference
			// on the handler.
			nni_list_remove(&s->handlers, h);
			rv = NNG_OK;
			break;
		}
	}
	nni_mtx_unlock(&s->mtx);

	return (rv);
}